

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O1

double ON_GrevilleAbcissa(int order,double *knot)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  uint uVar5;
  double dVar6;
  double dVar7;
  
  if (2 < order) {
    dVar1 = *knot;
    dVar2 = knot[(ulong)(uint)order - 2];
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      uVar5 = order - 1;
      dVar7 = (dVar2 - dVar1) * 1.490116119385e-08;
      dVar3 = knot[uVar5 >> 1];
      if (uVar5 == 0) {
        dVar6 = 0.0;
      }
      else {
        dVar6 = 0.0;
        lVar4 = 0;
        do {
          dVar6 = dVar6 + knot[lVar4];
          lVar4 = lVar4 + 1;
        } while (uVar5 != (uint)lVar4);
      }
      dVar6 = dVar6 / (double)(int)uVar5;
      if (dVar7 < ABS((dVar3 + dVar3) - (dVar1 + dVar2))) {
        return dVar6;
      }
      if (ABS(dVar6) * 1.490116119385e-08 + dVar7 < ABS(dVar6 - dVar3)) {
        return dVar6;
      }
      return dVar3;
    }
  }
  return *knot;
}

Assistant:

double ON_GrevilleAbcissa( // get Greville abcissa
          int order,          // order (>=2)
          const double* knot  // knot[order-1] array
          )

{
  double g=0.0;
  if ( order <= 2 || knot[0] == knot[order-2]) 
  {
    g = knot[0]; // degree = 1 or fully multiple knot
  }
  else 
  {
    // g = (knot[i]+...+knot[i+degree-1])/degree
    order--;
    const double k0 = knot[0];
    const double k = knot[order/2];
    const double k1 = knot[order-1];
    const double tol = (k1-k0)*ON_SQRT_EPSILON;
    const double const_ord = (double)order;
    while ( order--) 
    {
      g += *knot++;
    }
    //g /= ((double)order);
    g /= const_ord;
    if ( fabs(2*k - (k0+k1)) <= tol && fabs(g-k) <= (fabs(g)*ON_SQRT_EPSILON+tol) )
      g = k; // sets g to exact value when knot vector is uniform
  }
  return g;
}